

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O1

filename_t *
spdlog::sinks::daily_filename_calculator::calc_filename
          (filename_t *__return_storage_ptr__,filename_t *filename,tm *now_tm)

{
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  filename_t ext;
  filename_t basename;
  undefined1 *local_2e0;
  undefined8 uStack_2d8;
  undefined1 local_2d0;
  undefined7 uStack_2cf;
  undefined1 *local_2c0;
  undefined8 uStack_2b8;
  undefined1 local_2b0;
  undefined7 uStack_2af;
  undefined1 local_2a0 [32];
  _Alloc_hider local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270 [30];
  undefined1 *local_88;
  undefined8 uStack_80;
  ulong local_78;
  ulong local_68;
  ulong local_58;
  undefined1 *local_48;
  undefined8 uStack_40;
  
  uStack_2b8 = 0;
  local_2b0 = 0;
  uStack_2d8 = 0;
  local_2d0 = 0;
  local_2e0 = &local_2d0;
  local_2c0 = &local_2b0;
  details::file_helper::split_by_extenstion
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2a0,filename);
  std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_280);
  std::__cxx11::string::operator=((string *)&local_2e0,(string *)local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_p != local_270) {
    operator_delete(local_280._M_p,local_270[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  local_2a0._16_8_ = 0;
  local_2a0._0_8_ = &PTR_grow_001e6e30;
  local_2a0._24_8_ = 500;
  local_68 = (ulong)(now_tm->tm_mon + 1);
  local_78 = (ulong)(now_tm->tm_year + 0x76c);
  local_88 = local_2c0;
  uStack_80 = uStack_2b8;
  local_58 = (ulong)(uint)now_tm->tm_mday;
  local_48 = local_2e0;
  uStack_40 = uStack_2d8;
  format_str.size_ = 0x19;
  format_str.data_ = "{}_{:04d}-{:02d}-{:02d}{}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_88;
  args.types_ = 0xb222b;
  local_2a0._8_8_ = (string *)&local_280;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_2a0,format_str,args);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_2a0._8_8_,
             (string *)(local_2a0._8_8_ + local_2a0._16_8_));
  local_2a0._0_8_ = &PTR_grow_001e6e30;
  if ((string *)local_2a0._8_8_ != (string *)&local_280) {
    operator_delete((void *)local_2a0._8_8_,local_2a0._24_8_);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,CONCAT71(uStack_2cf,local_2d0) + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,CONCAT71(uStack_2af,local_2b0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static filename_t calc_filename(const filename_t &filename, const tm &now_tm)
    {
        filename_t basename, ext;
        std::tie(basename, ext) = details::file_helper::split_by_extenstion(filename);
        std::conditional<std::is_same<filename_t::value_type, char>::value, fmt::memory_buffer, fmt::wmemory_buffer>::type w;
        fmt::format_to(
            w, SPDLOG_FILENAME_T("{}_{:04d}-{:02d}-{:02d}{}"), basename, now_tm.tm_year + 1900, now_tm.tm_mon + 1, now_tm.tm_mday, ext);
        return fmt::to_string(w);
    }